

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObserverManager.h
# Opt level: O2

void ObserverManager::subscribe<FooBarProtocol,A>(A *observer)

{
  mapped_type *pp_Var1;
  FooBarProtocol *unaff_retaddr;
  
  if (observer != (A *)0x0) {
    pp_Var1 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_std::allocator<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_std::allocator<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&unsubscribeMap,
                           &(observer->super_FooBarProtocol).super_BaseObserverProtocol.observerId);
    *pp_Var1 = ObserverContainer<FooBarProtocol>::removeObserver;
    ObserverContainer<FooBarProtocol>::addObserver(unaff_retaddr);
    return;
  }
  return;
}

Assistant:

static void subscribe(O* observer) {
        static_assert(std::is_base_of<BaseObserverProtocol, O>::value,
                      "All observers must inherit from BaseObserverProtocol");
        if (observer == nullptr) {
            return;
        }

        unsubscribeMap[observer->P::observerId] = &ObserverContainer<P>::removeObserver;
        ObserverContainer<P>::addObserver(observer);
    }